

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O3

bool jsoncons::jsonpath::operator==(basic_path_node<char> *lhs,basic_path_node<char> *rhs)

{
  path_node_kind pVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  
  if (lhs->size_ == rhs->size_) {
    do {
      pVar1 = lhs->node_kind_;
      if (pVar1 != rhs->node_kind_) goto LAB_003ce2f7;
      bVar3 = true;
      if (pVar1 < index) {
        __n = (lhs->name_)._M_len;
        if ((__n != (rhs->name_)._M_len) ||
           ((__n != 0 && (iVar2 = bcmp((lhs->name_)._M_str,(rhs->name_)._M_str,__n), iVar2 != 0))))
        goto LAB_003ce2f7;
      }
      else if (pVar1 == index) {
        bVar3 = lhs->index_ == rhs->index_;
      }
      lhs = lhs->parent_;
    } while ((lhs != (basic_path_node<char> *)0x0) && (rhs = rhs->parent_, bVar3 != false));
  }
  else {
LAB_003ce2f7:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

std::size_t size() const
        {
            return size_;
        }